

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

int nn_send(int s,void *buf,size_t len,int flags)

{
  int iVar1;
  nn_iovec iov;
  nn_iovec local_30;
  nn_msghdr local_20;
  
  local_20.msg_iov = &local_30;
  local_20.msg_iovlen = 1;
  local_20.msg_control = (void *)0x0;
  local_20.msg_controllen = 0;
  local_30.iov_base = buf;
  local_30.iov_len = len;
  iVar1 = nn_sendmsg(s,&local_20,flags);
  return iVar1;
}

Assistant:

int nn_send (int s, const void *buf, size_t len, int flags)
{
    struct nn_iovec iov;
    struct nn_msghdr hdr;

    iov.iov_base = (void*) buf;
    iov.iov_len = len;

    hdr.msg_iov = &iov;
    hdr.msg_iovlen = 1;
    hdr.msg_control = NULL;
    hdr.msg_controllen = 0;

    return nn_sendmsg (s, &hdr, flags);
}